

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O2

qsizetype __thiscall
QCborStreamReaderPrivate::readStringChunk_unicode
          (QCborStreamReaderPrivate *this,ReadStringChunk params,qsizetype utf8len)

{
  long lVar1;
  char16_t *pcVar2;
  char16_t *pcVar3;
  QUtf8 *this_00;
  State *__nbytes;
  __off_t extraout_RDX_00;
  __off_t __length;
  anon_union_8_3_4d1d901a_for_ReadStringChunk_0 this_01;
  long size;
  State *in_R8;
  char16_t *dst;
  char16_t *asize;
  char16_t *buffer;
  char *__file;
  qsizetype qVar4;
  long in_FS_OFFSET;
  QByteArrayView in;
  QByteArrayView in_00;
  State local_1b0;
  QVarLengthArray<char,_256LL> chunk;
  State local_68;
  long local_38;
  __off_t extraout_RDX;
  
  this_01 = params.field_0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = ((DataPointer *)&(this_01.array)->d)->size;
  size = lVar1 + utf8len;
  __nbytes = (State *)CONCAT71((int7)((ulong)utf8len >> 8),-1 < size);
  if (utf8len < 0x3ffffffffffffff7 && -1 < size) {
    QString::resize(this_01.string,size);
    pcVar2 = ((DataPointer *)&(this_01.array)->d)->ptr;
    this_00 = (QUtf8 *)(pcVar2 + lVar1);
    local_68.flags.super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
    super_QFlagsStorage<QStringConverterBase::Flag>.i =
         (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)
         (QFlagsStorage<QStringConverterBase::Flag>)0x1;
    local_68.internalState = 0;
    local_68.remainingChars._0_4_ = 0;
    local_68.remainingChars._4_4_ = 0;
    local_68.invalidChars._0_4_ = 0;
    local_68.invalidChars._4_4_ = 0;
    local_68.field_4.state_data[0] = 0;
    local_68.field_4.state_data[1] = 0;
    local_68.field_4.state_data[2] = 0;
    local_68.field_4.state_data[3] = 0;
    local_68.clearFn = (ClearDataFn)0x0;
    if (this->device == (QIODevice *)0x0) {
      in_00.m_size = (this->buffer).d.ptr + this->bufferStart;
      in_00.m_data = (storage_type *)&local_68;
      this_00 = (QUtf8 *)QUtf8::convertToUnicode(this_00,(char16_t *)utf8len,in_00,in_R8);
      __length = extraout_RDX;
    }
    else {
      asize = (char16_t *)0x4000;
      if (utf8len < 0x4000) {
        asize = (char16_t *)utf8len;
      }
      memset(&chunk,0xaa,0x118);
      QVarLengthArray<char,_256LL>::QVarLengthArray(&chunk,(qsizetype)asize);
      local_1b0.flags.super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
      super_QFlagsStorage<QStringConverterBase::Flag>.i =
           (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)
           (QFlagsStorage<QStringConverterBase::Flag>)0x8;
      local_1b0._4_8_ = 0;
      local_1b0._12_8_ = 0;
      local_1b0._20_8_ = 0;
      local_1b0.field_4.state_data[1] = 0;
      local_1b0.field_4.state_data[2] = 0;
      local_1b0.field_4.state_data[3] = 0;
      local_1b0.clearFn = (ClearDataFn)0x0;
      QStringConverterBase::State::operator=(&local_68,&local_1b0);
      QStringConverterBase::State::clear(&local_1b0);
      while ((0 < utf8len &&
             (CONCAT44(local_68.invalidChars._4_4_,(undefined4)local_68.invalidChars) == 0))) {
        dst = (char16_t *)utf8len;
        if ((long)asize < utf8len) {
          dst = asize;
        }
        pcVar3 = (char16_t *)
                 QIODevice::read(this->device,(int)chunk.super_QVLABase<char>.super_QVLABaseBase.ptr
                                 ,dst,(size_t)__nbytes);
        if (pcVar3 != dst) {
          this->corrupt = true;
          (this->lastError).c = InputOutputError;
          QVarLengthArray<char,_256LL>::~QVarLengthArray(&chunk);
          goto LAB_0043e235;
        }
        in.m_data = (storage_type *)&local_68;
        in.m_size = (qsizetype)chunk.super_QVLABase<char>.super_QVLABaseBase.ptr;
        __nbytes = &local_68;
        this_00 = (QUtf8 *)QUtf8::convertToUnicode(this_00,dst,in,in_R8);
        utf8len = utf8len - (long)dst;
      }
      QVarLengthArray<char,_256LL>::~QVarLengthArray(&chunk);
      __length = extraout_RDX_00;
    }
    if (CONCAT44(local_68.remainingChars._4_4_,(undefined4)local_68.remainingChars) == 0 &&
        CONCAT44(local_68.invalidChars._4_4_,(undefined4)local_68.invalidChars) == 0) {
      __file = (char *)((long)this_00 - (long)pcVar2 >> 1);
      QString::truncate(this_01.string,__file,__length);
      qVar4 = (long)__file - lVar1;
    }
    else {
      this->corrupt = true;
      (this->lastError).c = InvalidUtf8String;
LAB_0043e235:
      qVar4 = -1;
    }
    QStringConverterBase::State::clear(&local_68);
  }
  else {
    this->corrupt = true;
    (this->lastError).c = DataTooLarge;
    qVar4 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return qVar4;
  }
  __stack_chk_fail();
}

Assistant:

inline qsizetype
QCborStreamReaderPrivate::readStringChunk_unicode(ReadStringChunk params, qsizetype utf8len)
{
    Q_ASSERT(params.isString());

    // See QUtf8::convertToUnicode() a detailed explanation of why this
    // conversion uses the same number of words or less.
    qsizetype currentSize = params.string->size();
    size_t newSize = size_t(utf8len) + size_t(currentSize); // can't overflow
    if (utf8len > QString::maxSize() || qsizetype(newSize) < 0) {
        handleError(CborErrorDataTooLarge);
        return -1;
    }
    QT_TRY {
        params.string->resize(qsizetype(newSize));
    }